

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

void __thiscall minibag::UncompressedStream::~UncompressedStream(UncompressedStream *this)

{
  Stream::~Stream(&this->super_Stream);
  operator_delete(this,0x10);
  return;
}

Assistant:

class ROSBAG_STORAGE_DECL UncompressedStream : public Stream
{
public:
    UncompressedStream(ChunkedFile* file);

    CompressionType getCompressionType() const;

    void write(void* ptr, size_t size);
    void read(void* ptr, size_t size);

    void decompress(uint8_t* dest, unsigned int dest_len, uint8_t* source, unsigned int source_len);
}